

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

bool duckdb::Timestamp::TryFromTimestampNanos
               (timestamp_t input,int32_t nanos,timestamp_ns_t *result)

{
  long lVar1;
  bool bVar2;
  
  if ((input.value == 0x7fffffffffffffff) || (input.value == -0x7fffffffffffffff)) {
    (result->super_timestamp_t).value = input.value;
    bVar2 = true;
  }
  else {
    bVar2 = TryMultiplyOperator::Operation<long,long,long>(input.value,1000,(int64_t *)result);
    if ((bVar2) &&
       (bVar2 = TryAddOperator::Operation<long,long,long>
                          ((result->super_timestamp_t).value,(long)nanos,(int64_t *)result), bVar2))
    {
      lVar1 = (result->super_timestamp_t).value;
      return lVar1 != -0x7fffffffffffffff && lVar1 != 0x7fffffffffffffff;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Timestamp::TryFromTimestampNanos(timestamp_t input, int32_t nanos, timestamp_ns_t &result) {
	if (!IsFinite(input)) {
		result.value = input.value;
		return true;
	}
	// Scale to ns
	if (!TryMultiplyOperator::Operation(input.value, Interval::NANOS_PER_MICRO, result.value)) {
		return false;
	}

	if (!TryAddOperator::Operation(result.value, int64_t(nanos), result.value)) {
		return false;
	}

	return IsFinite(result);
}